

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  u64 n;
  sqlite3_module *psVar1;
  _func_int_sqlite3_vtab_ptr *p_Var2;
  int iVar3;
  sqlite3_vtab_cursor *__s;
  
  psVar1 = pVTab[1].pModule;
  iVar3 = fts5NewTransaction((Fts5FullTable *)pVTab);
  if (iVar3 == 0) {
    n = (long)*(int *)&psVar1->xBestIndex * 4 + 0xb8;
    iVar3 = sqlite3_initialize();
    if (iVar3 == 0) {
      __s = (sqlite3_vtab_cursor *)sqlite3Malloc(n);
    }
    else {
      __s = (sqlite3_vtab_cursor *)0x0;
    }
    if (__s != (sqlite3_vtab_cursor *)0x0) {
      psVar1 = pVTab[2].pModule;
      memset(__s,0,n);
      __s[2].pVtab = (sqlite3_vtab *)(__s + 0x17);
      __s[1].pVtab = (sqlite3_vtab *)psVar1->xNext;
      psVar1->xNext = (_func_int_sqlite3_vtab_cursor_ptr *)__s;
      p_Var2 = psVar1->xDestroy;
      psVar1->xDestroy = p_Var2 + 1;
      __s[3].pVtab = (sqlite3_vtab *)(p_Var2 + 1);
      iVar3 = 0;
      goto LAB_001b16f2;
    }
    iVar3 = 7;
  }
  __s = (sqlite3_vtab_cursor *)0x0;
LAB_001b16f2:
  *ppCsr = __s;
  return iVar3;
}

Assistant:

static int fts5OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)pVTab;
  Fts5Config *pConfig = pTab->p.pConfig;
  Fts5Cursor *pCsr = 0;           /* New cursor object */
  sqlite3_int64 nByte;            /* Bytes of space to allocate */
  int rc;                         /* Return code */

  rc = fts5NewTransaction(pTab);
  if( rc==SQLITE_OK ){
    nByte = sizeof(Fts5Cursor) + pConfig->nCol * sizeof(int);
    pCsr = (Fts5Cursor*)sqlite3_malloc64(nByte);
    if( pCsr ){
      Fts5Global *pGlobal = pTab->pGlobal;
      memset(pCsr, 0, (size_t)nByte);
      pCsr->aColumnSize = (int*)&pCsr[1];
      pCsr->pNext = pGlobal->pCsr;
      pGlobal->pCsr = pCsr;
      pCsr->iCsrId = ++pGlobal->iNextId;
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}